

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_sync_handler_failed_default_exception_branch
          (t_rs_generator *this,t_function *tfunc)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  ostream *poVar3;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_80);
  poVar3 = std::operator<<(poVar3,"let ret_err = {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_80);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  std::__cxx11::string::string((string *)&local_80,"ApplicationError",&local_81);
  std::__cxx11::string::string((string *)&local_60,"ApplicationErrorKind::Unknown",&local_82);
  std::__cxx11::string::string((string *)&local_40,"e.to_string()",&local_83);
  render_thrift_error_struct(this,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_80);
  poVar3 = std::operator<<(poVar3,"};");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_80);
  if (tfunc->oneway_ == true) {
    t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_80);
    poVar3 = std::operator<<(poVar3,"Err(thrift::Error::Application(ret_err))");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,"ret_err",(allocator *)&local_60);
    render_sync_handler_send_exception_response(this,tfunc,&local_80);
  }
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void t_rs_generator::render_sync_handler_failed_default_exception_branch(t_function *tfunc) {
  f_gen_ << indent() << "let ret_err = {" << endl;
  indent_up();
  render_thrift_error_struct("ApplicationError", "ApplicationErrorKind::Unknown", "e.to_string()");
  indent_down();
  f_gen_ << indent() << "};" << endl;
  if (tfunc->is_oneway()) {
    f_gen_ << indent() << "Err(thrift::Error::Application(ret_err))" << endl;
  } else {
    render_sync_handler_send_exception_response(tfunc, "ret_err");
  }
}